

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getTypeName_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  int iVar1;
  pointer ptVar2;
  TestError *this_00;
  char *pcVar3;
  GLchar *__s;
  
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(ptVar2[iVar1].m_initializer) {
  case VECTOR:
  case MATRIX:
  case MATRIX_ROWS:
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_VECTOR:
  case UNSIZED_ARRAY_MATRIX:
    if (ptVar2[iVar1].m_n_rows - 5 < 0xfffffffc || ptVar2[iVar1].m_n_cols - 5 < 0xfffffffc) {
      __s = (char *)0x0;
    }
    else {
      __s = Utils::getTypeName::float_lut[ptVar2[iVar1].m_n_cols - 1][ptVar2[iVar1].m_n_rows - 1];
    }
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
    return __return_storage_ptr__;
  case STRUCT:
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    pcVar3 = "BasicStructure";
    break;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    pcVar3 = "float";
    break;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    pcVar3 = "StructureWithStructure";
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    pcVar3 = "StructureWithStructArray";
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    pcVar3 = "StructureWithStructureWithArray";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3876);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getTypeName()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	static const GLchar* basic_struct = "BasicStructure";

	static const GLchar* struct_with_struct = "StructureWithStructure";

	static const GLchar* struct_with_struct_array = "StructureWithStructArray";

	static const GLchar* struct_with_struct_with_array = "StructureWithStructureWithArray";

	std::string type_name;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
		type_name = Utils::getTypeName(Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows);
		break;
	case STRUCT:
	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		type_name = basic_struct;
		break;
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		type_name = struct_with_struct;
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		type_name = struct_with_struct_array;
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		type_name = struct_with_struct_with_array;
		break;
	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		type_name = "float";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return type_name;
}